

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>_>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>_>
::operator=(SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>_>
            *this,SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>_>
                  *RHS)

{
  iterator MinSize;
  iterator pIVar1;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
  *local_e0;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>_>
  *RHS_local;
  SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>_>
  *this_local;
  
  if (this != RHS) {
    MinSize = (iterator)
              (((long)(RHS->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                      .super_SmallVectorBase.EndX -
               (long)(RHS->
                     super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                     ).
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                     .super_SmallVectorBase.BeginX) / 0x128);
    NewEnd = (iterator)
             (((long)(this->
                     super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                     ).
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                     .super_SmallVectorBase.EndX -
              (long)(this->
                    super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                    .super_SmallVectorBase.BeginX) / 0x128);
    if (NewEnd < MinSize) {
      pIVar1 = (iterator)
               SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
               ::capacity((SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                           *)this);
      if (pIVar1 < MinSize) {
        SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
        ::destroy_range((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                         *)(this->
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                           ).
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                           .super_SmallVectorBase.BeginX,
                        (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                         *)(this->
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                           ).
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                           .super_SmallVectorBase.EndX);
        SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
        ::setEnd((SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                  *)this,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                          *)(this->
                            super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                            ).
                            super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                            .super_SmallVectorBase.BeginX);
        NewEnd = (iterator)0x0;
        SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
        ::grow(&this->
                super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
               ,(size_t)MinSize);
      }
      else if (NewEnd != (iterator)0x0) {
        std::
        copy<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<104u,Fixpp::Type::Char>>>const*,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<104u,Fixpp::Type::Char>>>*>
                  ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                    *)(RHS->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                      .super_SmallVectorBase.BeginX,
                   (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                    *)((long)(RHS->
                             super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                             ).
                             super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                             .super_SmallVectorBase.BeginX + (long)NewEnd * 0x128),
                   (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                    *)(this->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                      .super_SmallVectorBase.BeginX);
      }
      SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<104u,Fixpp::Type::Char>>>,false>
      ::
      uninitialized_copy<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<104u,Fixpp::Type::Char>>>const*,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<104u,Fixpp::Type::Char>>>*>
                ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                  *)((long)(RHS->
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                           ).
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                           .super_SmallVectorBase.BeginX + (long)NewEnd * 0x128),
                 (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                  *)(RHS->
                    super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                    .super_SmallVectorBase.EndX,
                 (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                  *)((long)(this->
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                           ).
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                           .super_SmallVectorBase.BeginX + (long)NewEnd * 0x128));
      SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
      ::setEnd((SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                *)this,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                        *)((long)(this->
                                 super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                                 ).
                                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                                 .super_SmallVectorBase.BeginX + (long)MinSize * 0x128));
    }
    else {
      if (MinSize == (iterator)0x0) {
        local_e0 = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                    *)(this->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                      .super_SmallVectorBase.BeginX;
      }
      else {
        local_e0 = std::
                   copy<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<104u,Fixpp::Type::Char>>>const*,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<104u,Fixpp::Type::Char>>>*>
                             ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                               *)(RHS->
                                 super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                                 ).
                                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                                 .super_SmallVectorBase.BeginX,
                              (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                               *)((long)(RHS->
                                        super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                                        ).
                                        super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                                        .super_SmallVectorBase.BeginX + (long)MinSize * 0x128),
                              (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                               *)(this->
                                 super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                                 ).
                                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                                 .super_SmallVectorBase.BeginX);
      }
      SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
      ::destroy_range(local_e0,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>
                                *)(this->
                                  super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_false>
                                  ).
                                  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                                  .super_SmallVectorBase.EndX);
      SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
      ::setEnd((SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>_>,_void>
                *)this,local_e0);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}